

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_CustomComboAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *self_00;
  PClassActor *type;
  void *pvVar1;
  int iVar2;
  uint uVar3;
  VMValue *pVVar4;
  AActor *pAVar5;
  bool bVar6;
  double dVar7;
  int local_e4;
  bool local_b2;
  bool local_af;
  TFlags<ActorFlag2,_unsigned_int> local_ac;
  DVector3 local_a8;
  AActor *local_90;
  AActor *missile;
  double add;
  FName local_74;
  int local_70;
  FSoundID local_6c;
  int newdam;
  FName local_64;
  bool bleed;
  FName damagetype;
  FSoundID local_58;
  int local_54;
  FSoundID meleesound;
  int damage;
  double spawnheight;
  MetaClass *ti;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6ce,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6ce,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self_00 = *(AActor **)&param->field_0;
  local_af = true;
  if (self_00 != (AActor *)0x0) {
    local_af = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
  }
  if (local_af == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6ce,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6cf,
                  "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar6 = true, param[1].field_0.field_1.atag != 1)) {
    bVar6 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar6) {
    type = (PClassActor *)param[1].field_0.field_1.a;
    local_b2 = true;
    if (type != (PClassActor *)0x0) {
      local_b2 = PClass::IsDescendantOf((PClass *)type,AActor::RegistrationInfo.MyClass);
    }
    if (local_b2 == false) {
      __assert_fail("ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6cf,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d0,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d0,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    _meleesound = param[2].field_0.field_1.a;
    if (numparam < 4) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d1,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6d1,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_54 = param[3].field_0.i;
    FSoundID::FSoundID(&local_58);
    if (numparam < 5) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x6d2,
                      "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      FSoundID::FSoundID((FSoundID *)&stack0xffffffffffffffa0,(pVVar4->field_0).i);
      FSoundID::operator=(&local_58,(FSoundID *)&stack0xffffffffffffffa0);
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x6d2,
                      "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FSoundID::FSoundID((FSoundID *)&damagetype,param[4].field_0.i);
      FSoundID::operator=(&local_58,(FSoundID *)&damagetype);
    }
    FName::FName(&local_64);
    if (numparam < 6) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x6d3,
                      "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      FName::operator=(&local_64,(pVVar4->field_0).i);
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x6d3,
                      "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::operator=(&local_64,param[5].field_0.i);
    }
    if (numparam < 7) {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x6d4,
                      "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      iVar2 = (pVVar4->field_0).i;
    }
    else {
      if (param[6].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x6d4,
                      "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar2 = param[6].field_0.i;
    }
    newdam._3_1_ = iVar2 != 0;
    pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
    if (pAVar5 != (AActor *)0x0) {
      A_FaceTarget(self_00);
      bVar6 = AActor::CheckMeleeRange(self_00);
      pvVar1 = _meleesound;
      if (bVar6) {
        bVar6 = FName::operator==(&local_64,NAME_None);
        if (bVar6) {
          FName::operator=(&local_64,NAME_Melee);
        }
        iVar2 = FSoundID::operator_cast_to_int(&local_58);
        if (iVar2 != 0) {
          FSoundID::FSoundID(&local_6c,&local_58);
          S_Sound(self_00,1,&local_6c,1.0,1.0);
        }
        pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
        iVar2 = local_54;
        FName::FName(&local_74,&local_64);
        TAngle<double>::TAngle((TAngle<double> *)&add,0.0);
        local_70 = P_DamageMobj(pAVar5,self_00,self_00,iVar2,&local_74,0,(DAngle *)&add);
        if ((newdam._3_1_ & 1) != 0) {
          local_e4 = local_70;
          if (local_70 < 1) {
            local_e4 = local_54;
          }
          pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
          P_TraceBleed(local_e4,pAVar5,self_00);
        }
      }
      else if (type != (PClassActor *)0x0) {
        dVar7 = AActor::GetBobOffset(self_00,0.0);
        missile = (AActor *)(((double)pvVar1 + dVar7) - 32.0);
        AActor::AddZ(self_00,(double)missile,true);
        AActor::PosPlusZ(&local_a8,self_00,32.0);
        pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
        local_90 = P_SpawnMissileXYZ(&local_a8,self_00,pAVar5,type,false,(AActor *)0x0);
        AActor::AddZ(self_00,-(double)missile,true);
        if (local_90 != (AActor *)0x0) {
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_ac,(int)local_90 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ac);
          if (uVar3 != 0) {
            (local_90->tracer).field_0 = (self_00->target).field_0;
          }
          P_CheckMissileSpawn(local_90,self_00->radius);
        }
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x6cf,
                "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomComboAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT		(spawnheight);
	PARAM_INT		(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange())
	{
		if (damagetype == NAME_None)
			damagetype = NAME_Melee;	// Melee is the default type
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else if (ti) 
	{
		// This seemingly senseless code is needed for proper aiming.
		double add = spawnheight + self->GetBobOffset() - 32;
		self->AddZ(add);
		AActor *missile = P_SpawnMissileXYZ (self->PosPlusZ(32.), self, self->target, ti, false);
		self->AddZ(-add);

		if (missile)
		{
			// automatic handling of seeker missiles
			if (missile->flags2 & MF2_SEEKERMISSILE)
			{
				missile->tracer = self->target;
			}
			P_CheckMissileSpawn(missile, self->radius);
		}
	}
	return 0;
}